

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_io_blocks
               (NegativeTestContext *ctx)

{
  ostringstream source;
  string local_1a8;
  string local_188 [3];
  ios_base local_118 [264];
  
  local_188[0]._M_dataplus._M_p = (pointer)&local_188[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,
             "GL_EXT_shader_io_blocks features require enabling the extension in 310 es shaders.",""
            );
  NegativeTestContext::beginSection(ctx,local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188[0]._M_dataplus._M_p != &local_188[0].field_2) {
    operator_delete(local_188[0]._M_dataplus._M_p,local_188[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "#version 310 es\nin Data\n{\n\tmediump vec3 a;\n} data;\nvoid main()\n{\n}\n",0x43);
  std::__cxx11::stringbuf::str();
  verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1a8,EXPECT_RESULT_FAIL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void shader_io_blocks (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_EXT_shader_io_blocks features require enabling the extension in 310 es shaders.");
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"in Data\n"
					"{\n"
					"	mediump vec3 a;\n"
					"} data;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}